

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitTupleExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,TupleExpr *expr)

{
  bool bVar1;
  ostream *poVar2;
  type expr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *local_1e8;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *elem;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  *__range1;
  string separator;
  ostringstream local_198 [8];
  ostringstream s;
  TupleExpr *expr_local;
  AstSerialise *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,'(');
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
           ::begin(&expr->elems);
  elem = (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)
         std::
         vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
         ::end(&expr->elems);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_*,_std::vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>_>
                                *)&elem);
    if (!bVar1) break;
    local_1e8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_*,_std::vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>_>
                ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)local_198,(string *)&__range1);
    expr_00 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*(local_1e8);
    ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    visitExpr(&local_208,
              &(this->
               super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,expr_00);
    std::operator<<(poVar2,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::operator=((string *)&__range1,", ");
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_*,_std::vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)local_198,')');
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitTupleExpr(TupleExpr &expr) {
        std::ostringstream s;
        s << '(';

        std::string separator;
        for (const std::unique_ptr<Expr>& elem : expr.elems) {
            s << separator << visitExpr(*elem);
            separator = ", ";
        }

        s << ')';
        return s.str();
    }